

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O0

int Ucs1CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  ulong local_50;
  size_t i;
  uint *puStack_40;
  Col_Char c;
  char *p;
  CopyDataInfo *info;
  Col_ClientData clientData_local;
  Col_RopeChunk *chunks_local;
  size_t number_local;
  size_t length_local;
  size_t index_local;
  
  puStack_40 = (uint *)chunks->data;
  local_50 = 0;
  do {
    if (length <= local_50) {
      return 0;
    }
    if (chunks->format == COL_UCS1) {
      local_54 = (uint)(byte)*puStack_40;
    }
    else {
      if (chunks->format == COL_UCS2) {
        local_58 = (uint)(ushort)*puStack_40;
      }
      else {
        if (chunks->format == COL_UCS4) {
          local_5c = *puStack_40;
        }
        else {
          if (chunks->format == COL_UTF8) {
            local_60 = Col_Utf8Get((Col_Char1 *)puStack_40);
          }
          else {
            if (chunks->format == COL_UTF16) {
              local_64 = Col_Utf16Get((Col_Char2 *)puStack_40);
            }
            else {
              local_64 = 0xffffffff;
            }
            local_60 = local_64;
          }
          local_5c = local_60;
        }
        local_58 = local_5c;
      }
      local_54 = local_58;
    }
    i._4_1_ = (undefined1)local_54;
    if (local_54 < 0x100) {
LAB_0010d16c:
      **clientData = i._4_1_;
      *(long *)clientData = *clientData + 1;
    }
    else if (*(int *)((long)clientData + 8) != -1) {
      i._4_1_ = (undefined1)*(undefined4 *)((long)clientData + 8);
      goto LAB_0010d16c;
    }
    local_50 = local_50 + 1;
    if (chunks->format == COL_UCS1) {
      local_70 = (uint *)((long)puStack_40 + 1);
    }
    else {
      if (chunks->format == COL_UCS2) {
        local_78 = (uint *)((long)puStack_40 + 2);
      }
      else {
        if (chunks->format == COL_UCS4) {
          local_80 = puStack_40 + 1;
        }
        else {
          if (chunks->format == COL_UTF8) {
            local_88 = (uint *)Col_Utf8Next((Col_Char1 *)puStack_40);
          }
          else {
            if (chunks->format == COL_UTF16) {
              local_90 = (uint *)Col_Utf16Next((Col_Char2 *)puStack_40);
            }
            else {
              local_90 = (uint *)0x0;
            }
            local_88 = local_90;
          }
          local_80 = local_88;
        }
        local_78 = local_80;
      }
      local_70 = local_78;
    }
    puStack_40 = local_70;
  } while( true );
}

Assistant:

static int
Ucs1CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c > COL_CHAR1_MAX) {
            if (info->replace == COL_CHAR_INVALID) continue;
            c = info->replace;
        }
        *(Col_Char1 *) info->data = c;
        info->data += CHAR_WIDTH(COL_UCS1);
    }
    return 0;
}